

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O2

void select_setup(void)

{
  t_symbol *ptVar1;
  
  ptVar1 = gensym("select");
  sel1_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x50,0,A_NULL);
  class_doaddfloat(sel1_class,sel1_float);
  class_addsymbol(sel1_class,sel1_symbol);
  ptVar1 = gensym("select");
  sel2_class = class_new(ptVar1,(t_newmethod)0x0,sel2_free,0x50,0,A_NULL);
  class_doaddfloat(sel2_class,sel2_float);
  class_addsymbol(sel2_class,sel2_symbol);
  ptVar1 = gensym("select");
  class_addcreator(select_new,ptVar1,A_GIMME,0);
  ptVar1 = gensym("sel");
  class_addcreator(select_new,ptVar1,A_GIMME,0);
  return;
}

Assistant:

void select_setup(void)
{
    sel1_class = class_new(gensym("select"), 0, 0,
        sizeof(t_sel1), 0, 0);
    class_addfloat(sel1_class, sel1_float);
    class_addsymbol(sel1_class, sel1_symbol);

    sel2_class = class_new(gensym("select"), 0, (t_method)sel2_free,
        sizeof(t_sel2), 0, 0);
    class_addfloat(sel2_class, sel2_float);
    class_addsymbol(sel2_class, sel2_symbol);

    class_addcreator((t_newmethod)select_new, gensym("select"),  A_GIMME, 0);
    class_addcreator((t_newmethod)select_new, gensym("sel"),  A_GIMME, 0);
}